

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk40(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk40 *peVar4;
  envy_bios_power_unk40_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk40 *unk40;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk40;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk40.version);
    if ((bios->power).unk40.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk40.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk40.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk40.entriesnum);
      (bios->power).unk40.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk40_entry *)malloc((ulong)(bios->power).unk40.entriesnum << 2);
      (bios->power).unk40.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk40.entriesnum; data = data + 1) {
        (bios->power).unk40.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk40.hlen + data * (bios->power).unk40.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown POWER LEAKAGE table version 0x%x\n",
              (ulong)(bios->power).unk40.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk40(struct envy_bios *bios) {
	struct envy_bios_power_unk40 *unk40 = &bios->power.unk40;
	int i, err = 0;

	if (!unk40->offset)
		return -EINVAL;

	bios_u8(bios, unk40->offset + 0x0, &unk40->version);
	switch(unk40->version) {
	case 0x10:
		err |= bios_u8(bios, unk40->offset + 0x1, &unk40->hlen);
		err |= bios_u8(bios, unk40->offset + 0x2, &unk40->rlen);
		err |= bios_u8(bios, unk40->offset + 0x3, &unk40->entriesnum);
		unk40->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER LEAKAGE table version 0x%x\n", unk40->version);
		return -EINVAL;
	};

	err = 0;
	unk40->entries = malloc(unk40->entriesnum * sizeof(struct envy_bios_power_unk40_entry));
	for (i = 0; i < unk40->entriesnum; i++) {
		uint32_t data = unk40->offset + unk40->hlen + i * unk40->rlen;

		unk40->entries[i].offset = data;
	}

	return 0;
}